

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SceneCombiner.cpp
# Opt level: O1

void Assimp::SceneCombiner::Copy(aiAnimation **_dest,aiAnimation *src)

{
  aiNodeAnim **ppaVar1;
  aiMeshMorphAnim **ppaVar2;
  aiAnimation *__dest;
  aiNodeAnim **ppaVar3;
  aiMeshMorphAnim **ppaVar4;
  ulong uVar5;
  ulong uVar6;
  
  if (src != (aiAnimation *)0x0 && _dest != (aiAnimation **)0x0) {
    __dest = (aiAnimation *)operator_new(0x448);
    (__dest->mName).length = 0;
    (__dest->mName).data[0] = '\0';
    memset((__dest->mName).data + 1,0x1b,0x3ff);
    __dest->mDuration = -1.0;
    __dest->mTicksPerSecond = 0.0;
    __dest->mNumChannels = 0;
    __dest->mChannels = (aiNodeAnim **)0x0;
    __dest->mNumMeshChannels = 0;
    __dest->mMeshChannels = (aiMeshAnim **)0x0;
    __dest->mNumMorphMeshChannels = 0;
    __dest->mMorphMeshChannels = (aiMeshMorphAnim **)0x0;
    *_dest = __dest;
    memcpy(__dest,src,0x448);
    if ((ulong)__dest->mNumChannels == 0) {
      __dest->mChannels = (aiNodeAnim **)0x0;
    }
    else {
      ppaVar1 = src->mChannels;
      uVar6 = (ulong)__dest->mNumChannels << 3;
      ppaVar3 = (aiNodeAnim **)operator_new__(uVar6);
      __dest->mChannels = ppaVar3;
      uVar5 = 0;
      do {
        Copy((aiNodeAnim **)((long)__dest->mChannels + uVar5),
             *(aiNodeAnim **)((long)ppaVar1 + uVar5));
        uVar5 = uVar5 + 8;
      } while (uVar6 != uVar5);
    }
    if ((ulong)__dest->mNumMorphMeshChannels == 0) {
      __dest->mMorphMeshChannels = (aiMeshMorphAnim **)0x0;
    }
    else {
      ppaVar2 = src->mMorphMeshChannels;
      uVar6 = (ulong)__dest->mNumMorphMeshChannels << 3;
      ppaVar4 = (aiMeshMorphAnim **)operator_new__(uVar6);
      __dest->mMorphMeshChannels = ppaVar4;
      uVar5 = 0;
      do {
        Copy((aiMeshMorphAnim **)((long)__dest->mMorphMeshChannels + uVar5),
             *(aiMeshMorphAnim **)((long)ppaVar2 + uVar5));
        uVar5 = uVar5 + 8;
      } while (uVar6 != uVar5);
    }
  }
  return;
}

Assistant:

void SceneCombiner::Copy( aiAnimation** _dest, const aiAnimation* src ) {
    if ( nullptr == _dest || nullptr == src ) {
        return;
    }

    aiAnimation* dest = *_dest = new aiAnimation();

    // get a flat copy
    ::memcpy(dest,src,sizeof(aiAnimation));

    // and reallocate all arrays
    CopyPtrArray( dest->mChannels, src->mChannels, dest->mNumChannels );
    CopyPtrArray( dest->mMorphMeshChannels, src->mMorphMeshChannels, dest->mNumMorphMeshChannels );
}